

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool __thiscall QToolBarAreaLayout::isEmpty(QToolBarAreaLayout *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  qsizetype *pqVar4;
  
  if (this->docks[0].lines.d.size != 0) {
    return false;
  }
  pqVar4 = &this->docks[1].lines.d.size;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar3 == 3) break;
    lVar1 = *pqVar4;
    pqVar4 = pqVar4 + 7;
    uVar2 = uVar3 + 1;
  } while (lVar1 == 0);
  return 2 < uVar3;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }